

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O2

int If_ManImproveCutCost(If_Man_t *p,Vec_Ptr_t *vFront)

{
  void *pvVar1;
  int i;
  int iVar2;
  
  iVar2 = 0;
  for (i = 0; i < vFront->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(vFront,i);
    iVar2 = iVar2 + (uint)(*(int *)((long)pvVar1 + 0xc) == 0);
  }
  return iVar2;
}

Assistant:

int If_ManImproveCutCost( If_Man_t * p, Vec_Ptr_t * vFront )
{
    If_Obj_t * pFanin;
    int i, Counter = 0;
    Vec_PtrForEachEntry( If_Obj_t *, vFront, pFanin, i )
        if ( pFanin->nRefs == 0 )
            Counter++;
    return Counter;
}